

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

void __thiscall glslang::TType::deepCopy(TType *this,TType *copyOf)

{
  undefined1 local_50 [8];
  TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
  copied;
  TType *copyOf_local;
  TType *this_local;
  
  copied.
  super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
  ._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)copyOf;
  TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
  ::TMap((TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
          *)local_50);
  deepCopy(this,(TType *)copied.
                         super_map<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>,_glslang::pool_allocator<std::pair<glslang::TVector<glslang::TTypeLoc>_*const,_glslang::TVector<glslang::TTypeLoc>_*>_>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_node_count,
           (TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
            *)local_50);
  TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
  ::~TMap((TMap<glslang::TVector<glslang::TTypeLoc>_*,_glslang::TVector<glslang::TTypeLoc>_*,_std::less<glslang::TVector<glslang::TTypeLoc>_*>_>
           *)local_50);
  return;
}

Assistant:

void deepCopy(const TType& copyOf)
    {
        TMap<TTypeList*,TTypeList*> copied;  // to enable copying a type graph as a graph, not a tree
        deepCopy(copyOf, copied);
    }